

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_e668::MovieState::parse_handler(MovieState *this)

{
  PacketQueue<2097152UL> *__mutex;
  PacketQueue<14680064UL> *__mutex_00;
  deque<AVPacket,_std::allocator<AVPacket>_> *this_00;
  deque<AVPacket,_std::allocator<AVPacket>_> *this_01;
  size_t *psVar1;
  AVMediaType AVar2;
  AVFormatContext *pAVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  _Elt_pointer pAVar10;
  uint uVar11;
  lock_guard<std::mutex> _;
  uint i;
  ulong uVar12;
  SDL_Event evt;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  unique_lock<std::mutex> lock_1;
  unique_lock<std::mutex> lock;
  uint local_64;
  
  uVar5 = 0xffffffff;
  uVar6 = 0xffffffff;
  for (uVar12 = 0;
      pAVar3 = (this->mFormatCtx)._M_t.
               super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
               _M_t.
               super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
               super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,
      uVar12 < pAVar3->nb_streams; uVar12 = uVar12 + 1) {
    AVar2 = pAVar3->streams[uVar12]->codecpar->codec_type;
    if (AVar2 == AVMEDIA_TYPE_VIDEO) {
      if (((anonymous_namespace)::DisableVideo == '\0') && ((int)uVar6 < 0)) {
        uVar6 = streamComponentOpen(this,(uint)uVar12);
      }
    }
    else if ((AVar2 == AVMEDIA_TYPE_AUDIO) && ((int)uVar5 < 0)) {
      uVar5 = streamComponentOpen(this,(uint)uVar12);
    }
  }
  if ((int)(uVar6 & uVar5) < 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&this->mFilename);
    poVar8 = std::operator<<(poVar8,": could not open codecs");
    std::endl<char,std::char_traits<char>>(poVar8);
    LOCK();
    (this->mQuit)._M_base._M_i = true;
    UNLOCK();
  }
  lVar9 = av_gettime();
  (this->mClockBase).__r = lVar9 + 750000;
  if (-1 < (int)uVar5) {
    lock._M_device = (mutex_type *)0x0;
    evt.common = (SDL_CommonEvent)operator_new(0x20);
    *(undefined ***)evt.common = &PTR___State_0010ec60;
    *(AudioState **)((long)evt.common + 8) = &this->mAudio;
    *(code **)((long)evt.common + 0x10) = AudioState::handler;
    *(undefined8 *)((long)evt.common + 0x18) = 0;
    std::thread::_M_start_thread(&lock,&evt,0);
    if (evt.common != (SDL_CommonEvent)0x0) {
      (**(code **)(*(long *)evt.common + 8))();
    }
    std::thread::operator=(&this->mAudioThread,(thread *)&lock);
    std::thread::~thread((thread *)&lock);
  }
  if (-1 < (int)uVar6) {
    lock._M_device = (mutex_type *)0x0;
    evt.common = (SDL_CommonEvent)operator_new(0x20);
    *(undefined ***)evt.common = &PTR___State_0010eca0;
    *(VideoState **)((long)evt.common + 8) = &this->mVideo;
    *(code **)((long)evt.common + 0x10) = VideoState::handler;
    *(undefined8 *)((long)evt.common + 0x18) = 0;
    std::thread::_M_start_thread(&lock,&evt,0);
    if (evt.common != (SDL_CommonEvent)0x0) {
      (**(code **)(*(long *)evt.common + 8))();
    }
    std::thread::operator=(&this->mVideoThread,(thread *)&lock);
    std::thread::~thread((thread *)&lock);
  }
  __mutex = &(this->mAudio).mPackets;
  __mutex_00 = &(this->mVideo).mPackets;
  this_00 = &(this->mAudio).mPackets.mPackets;
  this_01 = &(this->mVideo).mPackets.mPackets;
  uVar11 = uVar5;
LAB_001075e2:
  if ((((this->mQuit)._M_base._M_i & 1U) != 0) ||
     (iVar7 = av_read_frame((this->mFormatCtx)._M_t.
                            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                            .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,&lock),
     iVar7 < 0)) {
    if ((this->mVideo).mCodecCtx._M_t.
        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
        super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
      std::mutex::lock(&__mutex_00->mMutex);
      (this->mVideo).mPackets.mFinished = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
      std::condition_variable::notify_one();
    }
    if ((this->mAudio).mCodecCtx._M_t.
        super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
        super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
        super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl != (AVCodecContext *)0x0) {
      std::mutex::lock(&__mutex->mMutex);
      (this->mAudio).mPackets.mFinished = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::condition_variable::notify_one();
    }
    if ((this->mVideoThread)._M_id._M_thread != 0) {
      std::thread::join();
    }
    if ((this->mAudioThread)._M_id._M_thread != 0) {
      std::thread::join();
    }
    LOCK();
    (this->mVideo).mEOS._M_base._M_i = true;
    UNLOCK();
    std::unique_lock<std::mutex>::unique_lock(&lock,&(this->mVideo).mPictQMutex);
    while (((this->mVideo).mFinalUpdate._M_base._M_i & 1U) == 0) {
      std::condition_variable::wait((unique_lock *)&(this->mVideo).mPictQCond);
    }
    std::unique_lock<std::mutex>::unlock(&lock);
    evt.syswm.msg = (SDL_SysWMmsg *)0x0;
    evt._32_8_ = 0;
    evt._40_8_ = 0;
    evt.user.data1 = (void *)0x0;
    evt.user.data2 = (void *)0x0;
    evt._48_8_ = 0;
    evt._0_4_ = 0x8000;
    evt._4_4_ = 0;
    SDL_PushEvent();
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return 0;
  }
  if (local_64 == uVar6) {
    while (((this->mQuit)._M_base._M_i & 1U) == 0) {
      std::unique_lock<std::mutex>::unique_lock(&lock_1,&__mutex_00->mMutex);
      if ((this->mVideo).mPackets.mTotalSize < 0xe00000) {
        local_b8 = 0;
        uStack_b0 = 0;
        evt._48_8_ = 0;
        uStack_c0 = 0;
        evt._32_8_ = 0;
        evt._40_8_ = 0;
        evt.user.data1 = (void *)0x0;
        evt.user.data2 = (void *)0x0;
        evt._0_4_ = 0;
        evt._4_4_ = 0;
        evt.syswm.msg = (SDL_SysWMmsg *)0x0;
        local_a8 = 0;
        std::deque<AVPacket,_std::allocator<AVPacket>_>::emplace_back<AVPacket>
                  (this_01,(AVPacket *)&evt.common);
        pAVar10 = (this->mVideo).mPackets.mPackets.
                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pAVar10 ==
            *(_Elt_pointer *)
             ((long)&(this->mVideo).mPackets.mPackets.
                     super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                     super__Deque_impl_data._M_finish + 8)) {
          pAVar10 = (*(_Map_pointer *)
                      ((long)&(this->mVideo).mPackets.mPackets.
                              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                              super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
        }
        iVar7 = av_packet_ref(pAVar10 + -1,&lock);
        if (iVar7 != 0) {
          std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_back(this_01);
          uVar11 = 1;
          goto LAB_001076b5;
        }
        pAVar10 = (this->mVideo).mPackets.mPackets.
                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pAVar10 ==
            *(_Elt_pointer *)
             ((long)&(this->mVideo).mPackets.mPackets.
                     super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                     super__Deque_impl_data._M_finish + 8)) {
          pAVar10 = (*(_Map_pointer *)
                      ((long)&(this->mVideo).mPackets.mPackets.
                              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                              super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
        }
        psVar1 = &(this->mVideo).mPackets.mTotalSize;
        *psVar1 = *psVar1 + (ulong)(uint)pAVar10[-1].size;
        bVar4 = true;
      }
      else {
        uVar11 = 0;
LAB_001076b5:
        bVar4 = false;
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock_1);
      if (bVar4) goto LAB_0010782e;
      if ((uVar11 & 1) != 0) break;
      evt._0_4_ = 100;
      evt._4_4_ = 0;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&evt.common);
    }
  }
  else if (local_64 == uVar5) {
    while (((this->mQuit)._M_base._M_i & 1U) == 0) {
      std::unique_lock<std::mutex>::unique_lock(&lock_1,&__mutex->mMutex);
      if ((this->mAudio).mPackets.mTotalSize < 0x200000) {
        local_b8 = 0;
        uStack_b0 = 0;
        evt._48_8_ = 0;
        uStack_c0 = 0;
        evt._32_8_ = 0;
        evt._40_8_ = 0;
        evt.user.data1 = (void *)0x0;
        evt.user.data2 = (void *)0x0;
        evt._0_4_ = 0;
        evt._4_4_ = 0;
        evt.syswm.msg = (SDL_SysWMmsg *)0x0;
        local_a8 = 0;
        std::deque<AVPacket,_std::allocator<AVPacket>_>::emplace_back<AVPacket>
                  (this_00,(AVPacket *)&evt.common);
        pAVar10 = (this->mAudio).mPackets.mPackets.
                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pAVar10 ==
            *(_Elt_pointer *)
             ((long)&(this->mAudio).mPackets.mPackets.
                     super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                     super__Deque_impl_data._M_finish + 8)) {
          pAVar10 = (*(_Map_pointer *)
                      ((long)&(this->mAudio).mPackets.mPackets.
                              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                              super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
        }
        iVar7 = av_packet_ref(pAVar10 + -1,&lock);
        if (iVar7 != 0) {
          std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_back(this_00);
          uVar11 = 1;
          goto LAB_001077c4;
        }
        pAVar10 = (this->mAudio).mPackets.mPackets.
                  super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pAVar10 ==
            *(_Elt_pointer *)
             ((long)&(this->mAudio).mPackets.mPackets.
                     super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                     super__Deque_impl_data._M_finish + 8)) {
          pAVar10 = (*(_Map_pointer *)
                      ((long)&(this->mAudio).mPackets.mPackets.
                              super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                              super__Deque_impl_data._M_finish + 0x18))[-1] + 5;
        }
        psVar1 = &(this->mAudio).mPackets.mTotalSize;
        *psVar1 = *psVar1 + (ulong)(uint)pAVar10[-1].size;
        bVar4 = true;
      }
      else {
        uVar11 = 0;
LAB_001077c4:
        bVar4 = false;
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock_1);
      if (bVar4) goto LAB_0010782e;
      if ((uVar11 & 1) != 0) break;
      evt._0_4_ = 100;
      evt._4_4_ = 0;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&evt.common);
    }
  }
  goto LAB_00107833;
LAB_0010782e:
  std::condition_variable::notify_one();
LAB_00107833:
  av_packet_unref(&lock);
  goto LAB_001075e2;
}

Assistant:

int MovieState::parse_handler()
{
    auto &audio_queue = mAudio.mPackets;
    auto &video_queue = mVideo.mPackets;

    int video_index{-1};
    int audio_index{-1};

    /* Find the first video and audio streams */
    for(unsigned int i{0u};i < mFormatCtx->nb_streams;i++)
    {
        auto codecpar = mFormatCtx->streams[i]->codecpar;
        if(codecpar->codec_type == AVMEDIA_TYPE_VIDEO && !DisableVideo && video_index < 0)
            video_index = streamComponentOpen(i);
        else if(codecpar->codec_type == AVMEDIA_TYPE_AUDIO && audio_index < 0)
            audio_index = streamComponentOpen(i);
    }

    if(video_index < 0 && audio_index < 0)
    {
        std::cerr<< mFilename<<": could not open codecs" <<std::endl;
        mQuit = true;
    }

    /* Set the base time 750ms ahead of the current av time. */
    mClockBase = get_avtime() + milliseconds{750};

    if(audio_index >= 0)
        mAudioThread = std::thread{std::mem_fn(&AudioState::handler), &mAudio};
    if(video_index >= 0)
        mVideoThread = std::thread{std::mem_fn(&VideoState::handler), &mVideo};

    /* Main packet reading/dispatching loop */
    while(!mQuit.load(std::memory_order_relaxed))
    {
        AVPacket packet;
        if(av_read_frame(mFormatCtx.get(), &packet) < 0)
            break;

        /* Copy the packet into the queue it's meant for. */
        if(packet.stream_index == video_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !video_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }
        else if(packet.stream_index == audio_index)
        {
            while(!mQuit.load(std::memory_order_acquire) && !audio_queue.put(&packet))
                std::this_thread::sleep_for(milliseconds{100});
        }

        av_packet_unref(&packet);
    }
    /* Finish the queues so the receivers know nothing more is coming. */
    if(mVideo.mCodecCtx) video_queue.setFinished();
    if(mAudio.mCodecCtx) audio_queue.setFinished();

    /* all done - wait for it */
    if(mVideoThread.joinable())
        mVideoThread.join();
    if(mAudioThread.joinable())
        mAudioThread.join();

    mVideo.mEOS = true;
    std::unique_lock<std::mutex> lock{mVideo.mPictQMutex};
    while(!mVideo.mFinalUpdate)
        mVideo.mPictQCond.wait(lock);
    lock.unlock();

    SDL_Event evt{};
    evt.user.type = FF_MOVIE_DONE_EVENT;
    SDL_PushEvent(&evt);

    return 0;
}